

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  Allocator *pAVar4;
  pointer pfVar5;
  int *piVar6;
  undefined1 uVar7;
  char cVar8;
  float fVar9;
  int iVar10;
  uint uVar11;
  float fVar12;
  ulong uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar14;
  undefined4 extraout_var_01;
  void *pvVar15;
  undefined1 *puVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  float fVar21;
  void *pvVar22;
  long lVar23;
  char *pcVar24;
  int n_1;
  void *pvVar25;
  long lVar26;
  undefined4 *puVar27;
  int iVar28;
  void *pvVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  void *pvVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  undefined1 *puVar38;
  void *pvVar39;
  char *pcVar40;
  long lVar41;
  void *pvVar42;
  int p;
  undefined1 *puVar43;
  ulong uVar44;
  undefined1 *puVar45;
  char *ret;
  void *pvVar46;
  undefined4 uVar47;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar48 [12];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 uVar53;
  undefined4 uVar54;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1dc;
  undefined8 local_1d8;
  float fStack_1d0;
  float fStack_1cc;
  ulong local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined4 uStack_18c;
  ulong local_180;
  void *local_178;
  ulong local_170;
  undefined8 local_168;
  uint local_150;
  float local_14c;
  undefined1 local_148 [16];
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  int *local_128;
  int *local_120;
  void *local_118;
  char *local_110;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  Allocator *local_d0;
  Allocator *local_c8;
  void *local_c0;
  ulong local_b8;
  undefined1 *local_b0;
  int local_a8 [12];
  int *local_78;
  ulong local_70;
  Mat *local_68;
  ulong local_60;
  char *local_58;
  undefined1 *local_50;
  Allocator *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar13 = (ulong)(uint)stride_w;
  local_1d8 = (undefined1 *)(ulong)(uint)bottom_blob->c;
  local_f8 = _kernel->data;
  local_c0 = _bias->data;
  local_1b8 = (ulong)(uint)(kernel_h * kernel_w);
  uVar18 = bottom_blob->c * kernel_h * kernel_w;
  local_138 = CONCAT44(local_138._4_4_,top_blob->h);
  local_168 = (void *)CONCAT44(local_168._4_4_,top_blob->w);
  fVar9 = (float)(top_blob->h * top_blob->w);
  uVar34 = bottom_blob->w;
  local_180 = (ulong)top_blob->c;
  local_d0 = opt->workspace_allocator;
  local_68 = top_blob;
  if ((int)fVar9 * uVar18 == 0) {
    local_120 = (int *)0x0;
    pvVar15 = (void *)0x0;
  }
  else {
    local_198 = CONCAT44(local_198._4_4_,stride_w);
    uVar13 = (long)(int)((int)fVar9 * uVar18) + 3U & 0xfffffffffffffffc;
    if (local_d0 == (Allocator *)0x0) {
      local_1f8 = (void *)0x0;
      iVar10 = posix_memalign((void **)&local_1f8,0x10,uVar13 + 4);
      pvVar15 = local_1f8;
      if (iVar10 != 0) {
        local_1f8 = (void *)0x0;
        pvVar15 = local_1f8;
      }
    }
    else {
      iVar10 = (*local_d0->_vptr_Allocator[2])();
      pvVar15 = (void *)CONCAT44(extraout_var,iVar10);
    }
    local_120 = (int *)((long)pvVar15 + uVar13);
    *(undefined4 *)((long)pvVar15 + uVar13) = 1;
    uVar13 = local_198 & 0xffffffff;
  }
  if (0 < (int)(float)local_138) {
    local_108 = (ulong)(stride_h * uVar34);
    local_1a8._0_8_ = uVar13;
    lVar37 = 0;
    iVar30 = 0;
    iVar10 = 0;
    do {
      local_148._0_4_ = iVar10;
      local_e8._0_8_ = lVar37;
      if (0 < (int)(float)local_168) {
        iVar19 = 0;
        lVar36 = lVar37;
        do {
          local_198 = CONCAT44(local_198._4_4_,iVar19);
          if (0 < (int)(float)local_1d8) {
            puVar43 = (undefined1 *)0x0;
            do {
              if (0 < kernel_h) {
                sVar2 = bottom_blob->cstep;
                sVar3 = bottom_blob->elemsize;
                pvVar46 = bottom_blob->data;
                iVar28 = 0;
                lVar41 = lVar36;
                do {
                  if (0 < kernel_w) {
                    uVar44 = 0;
                    do {
                      *(undefined1 *)((long)pvVar15 + uVar44 + (long)iVar30) =
                           *(undefined1 *)
                            ((long)pvVar46 +
                            (long)((int)lVar41 + (int)uVar44) + sVar2 * (long)puVar43 * sVar3);
                      uVar44 = uVar44 + 1;
                    } while ((uint)kernel_w != uVar44);
                    iVar30 = iVar30 + (int)uVar44;
                  }
                  iVar28 = iVar28 + 1;
                  lVar41 = lVar41 + (ulong)uVar34;
                } while (iVar28 != kernel_h);
              }
              puVar43 = puVar43 + 1;
            } while (puVar43 != local_1d8);
          }
          iVar19 = iVar19 + 1;
          lVar36 = lVar36 + uVar13;
        } while ((float)iVar19 != (float)local_168);
      }
      iVar10 = iVar10 + 1;
      lVar37 = lVar37 + local_108;
    } while ((float)iVar10 != (float)local_138);
  }
  iVar10 = (int)local_1b8 * 4;
  fVar21 = (float)((int)fVar9 + 3);
  if (-1 < (int)fVar9) {
    fVar21 = fVar9;
  }
  local_c8 = opt->workspace_allocator;
  local_e8._0_4_ = (int)(float)local_1d8 * iVar10;
  local_1c0 = (long)(int)local_e8._0_4_ + 0xfU & 0xfffffffffffffff0;
  uVar13 = (long)((int)fVar9 + ((int)fVar21 >> 2) * -3) * local_1c0;
  local_1b0 = CONCAT44(local_1b0._4_4_,iVar10);
  local_118 = pvVar15;
  if (uVar13 == 0) {
    local_128 = (int *)0x0;
    pvVar46 = (void *)0x0;
  }
  else {
    if (local_c8 == (Allocator *)0x0) {
      local_1f8 = (void *)0x0;
      iVar10 = posix_memalign((void **)&local_1f8,0x10,uVar13 | 4);
      pvVar46 = local_1f8;
      if (iVar10 != 0) {
        local_1f8 = (void *)0x0;
        pvVar46 = local_1f8;
      }
    }
    else {
      iVar10 = (*local_c8->_vptr_Allocator[2])(local_c8,uVar13 | 4);
      pvVar46 = (void *)CONCAT44(extraout_var_00,iVar10);
    }
    local_128 = (int *)((long)pvVar46 + uVar13);
    *(undefined4 *)((long)pvVar46 + uVar13) = 1;
  }
  local_1dc = (float)((uint)fVar9 & 0xfffffffc);
  local_1a8._0_8_ = SEXT48((int)uVar18);
  if (0 < (int)fVar9 >> 2) {
    local_108 = CONCAT44(local_108._4_4_,uVar18) & 0xfffffffffffffffe;
    uVar44 = CONCAT44(0,(int)fVar9 >> 2);
    local_148._0_8_ = uVar44;
    local_138 = local_1a8._0_8_ * 4;
    lVar37 = (long)pvVar15 + local_1a8._0_8_;
    pvVar39 = (void *)((long)pvVar15 + local_1a8._0_8_ * 2);
    pvVar42 = (void *)(local_1a8._0_8_ * 3 + (long)pvVar15);
    pvVar22 = pvVar15;
    uVar13 = 0;
    pvVar25 = pvVar46;
    do {
      local_168 = pvVar25;
      local_198 = uVar13;
      puVar43 = (undefined1 *)(local_1c0 * local_198 + (long)pvVar46);
      if ((int)uVar18 < 2) {
        pvVar25 = (void *)(local_198 * 4 * local_1a8._0_8_ + (long)pvVar15);
        pvVar14 = (void *)((local_198 * 4 + 1) * local_1a8._0_8_ + (long)pvVar15);
        pvVar33 = (void *)((local_198 * 4 + 2) * local_1a8._0_8_ + (long)pvVar15);
        pvVar29 = (void *)((local_198 * 4 + 3) * local_1a8._0_8_ + (long)pvVar15);
        iVar10 = 0;
      }
      else {
        lVar36 = 0;
        do {
          puVar38 = puVar43;
          puVar43 = (undefined1 *)((long)local_168 + lVar36 * 4);
          *puVar43 = *(undefined1 *)((long)pvVar22 + lVar36);
          puVar43[1] = *(undefined1 *)((long)pvVar22 + lVar36 + 1);
          puVar43[2] = *(undefined1 *)(lVar37 + lVar36);
          puVar43[3] = *(undefined1 *)(lVar37 + 1 + lVar36);
          puVar43[4] = *(undefined1 *)((long)pvVar39 + lVar36);
          puVar43[5] = *(undefined1 *)((long)pvVar39 + lVar36 + 1);
          puVar43[6] = *(undefined1 *)((long)pvVar42 + lVar36);
          puVar43[7] = *(undefined1 *)((long)pvVar42 + lVar36 + 1);
          lVar41 = lVar36 + 2;
          iVar10 = (int)lVar36;
          puVar43 = puVar43 + 8;
          lVar36 = lVar41;
        } while (iVar10 + 3 < (int)uVar18);
        puVar43 = puVar38 + 8;
        pvVar25 = (void *)((long)pvVar22 + lVar41);
        pvVar14 = (void *)(lVar37 + lVar41);
        pvVar33 = (void *)((long)pvVar39 + lVar41);
        pvVar29 = (void *)(lVar41 + (long)pvVar42);
        iVar10 = (int)(float)local_108;
      }
      if (iVar10 < (int)uVar18) {
        lVar36 = 0;
        do {
          puVar43[lVar36 * 4] = *(undefined1 *)((long)pvVar25 + lVar36);
          puVar43[lVar36 * 4 + 1] = *(undefined1 *)((long)pvVar14 + lVar36);
          puVar43[lVar36 * 4 + 2] = *(undefined1 *)((long)pvVar33 + lVar36);
          puVar43[lVar36 * 4 + 3] = *(undefined1 *)((long)pvVar29 + lVar36);
          lVar36 = lVar36 + 1;
        } while (uVar18 - iVar10 != (int)lVar36);
      }
      pvVar22 = (void *)((long)pvVar22 + local_138);
      lVar37 = lVar37 + local_138;
      pvVar39 = (void *)((long)pvVar39 + local_138);
      pvVar42 = (void *)((long)pvVar42 + local_138);
      uVar13 = local_198 + 1;
      pvVar25 = (void *)((long)local_168 + local_1c0);
    } while (local_198 + 1 != uVar44);
  }
  if (local_1dc != fVar9) {
    lVar37 = (long)(int)local_1dc;
    do {
      puVar43 = (undefined1 *)(lVar37 * local_1a8._0_8_ + (long)pvVar15);
      uVar34 = (uint)lVar37;
      uVar11 = uVar34 + 3;
      if (-1 < (int)uVar34) {
        uVar11 = uVar34;
      }
      puVar38 = (undefined1 *)
                ((long)(int)(((int)uVar11 >> 2) + (uVar34 - (uVar11 & 0xfffffffc))) * local_1c0 +
                (long)pvVar46);
      if ((int)uVar18 < 2) {
        uVar34 = 0;
      }
      else {
        iVar10 = 1;
        do {
          *puVar38 = *puVar43;
          puVar38[1] = puVar43[1];
          puVar38 = puVar38 + 2;
          puVar43 = puVar43 + 2;
          iVar10 = iVar10 + 2;
          uVar34 = uVar18 & 0xfffffffe;
        } while (iVar10 < (int)uVar18);
      }
      if ((int)uVar34 < (int)uVar18) {
        lVar36 = 0;
        do {
          puVar38[lVar36] = puVar43[lVar36];
          lVar36 = lVar36 + 1;
        } while (uVar18 - uVar34 != (int)lVar36);
      }
      lVar37 = lVar37 + 1;
    } while (lVar37 < (int)fVar9);
  }
  uVar34 = (uint)local_180;
  uVar11 = uVar34 + 3;
  if (-1 < (int)uVar34) {
    uVar11 = uVar34;
  }
  uVar20 = uVar34 + 3;
  if (-1 < (int)uVar34) {
    uVar20 = uVar34;
  }
  pAVar4 = opt->workspace_allocator;
  local_170 = (long)((int)(float)local_1b0 * (int)(float)local_1d8) + 0xfU & 0xfffffffffffffff0;
  uVar13 = (long)(int)((uVar34 - (uVar20 & 0xfffffffc)) + ((int)uVar11 >> 2)) * local_170;
  if (uVar13 == 0) {
    local_178 = (void *)0x0;
    local_78 = (int *)0x0;
  }
  else {
    if (pAVar4 == (Allocator *)0x0) {
      local_1f8 = (void *)0x0;
      iVar10 = posix_memalign((void **)&local_1f8,0x10,uVar13 | 4);
      local_178 = local_1f8;
      if (iVar10 != 0) {
        local_1f8 = (void *)0x0;
        local_178 = local_1f8;
      }
    }
    else {
      iVar10 = (*pAVar4->_vptr_Allocator[2])(pAVar4,uVar13 | 4);
      local_178 = (void *)CONCAT44(extraout_var_01,iVar10);
    }
    local_78 = (int *)(uVar13 + (long)local_178);
    *(undefined4 *)((long)local_178 + uVar13) = 1;
  }
  fVar21 = (float)((int)local_180 >> 2);
  local_70 = local_180 & 0xfffffffffffffffc;
  local_60 = (ulong)(uint)fVar21;
  iVar10 = (int)local_1d8;
  if (0 < (int)fVar21) {
    iVar28 = iVar10 * (int)(float)local_1b8;
    local_168 = (void *)CONCAT44(local_168._4_4_,iVar28);
    local_1a8._0_4_ = uVar18 & 0xfffffffe;
    iVar19 = kernel_h * iVar10 * kernel_w;
    iVar30 = iVar19 * 3;
    iVar19 = iVar19 * 2;
    iVar31 = 0;
    uVar13 = 0;
    pvVar39 = local_178;
    uVar34 = uVar18;
    do {
      puVar43 = (undefined1 *)(local_170 * uVar13 + (long)local_178);
      local_198 = CONCAT44(local_198._4_4_,iVar30);
      if ((int)uVar18 < 2) {
        iVar32 = (int)uVar13;
        lVar37 = (long)((iVar32 * 4 + 3) * iVar28);
        lVar36 = (long)((iVar32 * 4 + 2) * iVar28);
        lVar41 = (long)((iVar32 * 4 + 1) * iVar28);
        lVar23 = (long)(iVar32 * 4 * iVar28);
        uVar11 = 0;
      }
      else {
        lVar37 = 0;
        do {
          puVar38 = puVar43;
          puVar43 = (undefined1 *)((long)pvVar39 + lVar37 * 4);
          *puVar43 = *(undefined1 *)((long)local_f8 + lVar37 + iVar31);
          puVar43[1] = *(undefined1 *)((long)local_f8 + lVar37 + (long)iVar31 + 1);
          puVar43[2] = *(undefined1 *)((long)local_f8 + lVar37 + (int)uVar34);
          puVar43[3] = *(undefined1 *)((long)local_f8 + lVar37 + (long)(int)uVar34 + 1);
          puVar43[4] = *(undefined1 *)((long)local_f8 + lVar37 + iVar19);
          puVar43[5] = *(undefined1 *)((long)local_f8 + lVar37 + (long)iVar19 + 1);
          puVar43[6] = *(undefined1 *)((long)local_f8 + lVar37 + iVar30);
          puVar43[7] = *(undefined1 *)((long)local_f8 + lVar37 + (long)iVar30 + 1);
          lVar23 = lVar37 + 2;
          iVar32 = (int)lVar37;
          lVar37 = lVar23;
          puVar43 = puVar43 + 8;
        } while (iVar32 + 3 < (int)uVar18);
        puVar43 = puVar38 + 8;
        lVar37 = lVar23 + iVar30;
        lVar36 = lVar23 + iVar19;
        lVar41 = lVar23 + (int)uVar34;
        lVar23 = lVar23 + iVar31;
        uVar11 = uVar18 & 0xfffffffe;
      }
      if ((int)uVar11 < (int)uVar18) {
        lVar26 = 0;
        do {
          puVar43[lVar26 * 4] = *(undefined1 *)((long)local_f8 + lVar26 + lVar23);
          puVar43[lVar26 * 4 + 1] = *(undefined1 *)((long)local_f8 + lVar26 + lVar41);
          puVar43[lVar26 * 4 + 2] = *(undefined1 *)((long)local_f8 + lVar26 + lVar36);
          puVar43[lVar26 * 4 + 3] = *(undefined1 *)((long)local_f8 + lVar26 + lVar37);
          lVar26 = lVar26 + 1;
        } while (uVar18 - uVar11 != (int)lVar26);
      }
      uVar13 = uVar13 + 1;
      pvVar39 = (void *)((long)pvVar39 + local_1c0);
      iVar30 = iVar30 + local_e8._0_4_;
      iVar19 = iVar19 + local_e8._0_4_;
      uVar34 = uVar34 + local_e8._0_4_;
      iVar31 = iVar31 + local_e8._0_4_;
    } while (uVar13 != local_60);
  }
  if ((int)local_70 != (int)local_180) {
    local_1d8 = (undefined1 *)(ulong)(uint)(iVar10 * (int)(float)local_1b8);
    uVar13 = local_70;
    do {
      uVar34 = (uint)uVar13;
      uVar11 = uVar34 + 3;
      if (-1 < (int)uVar34) {
        uVar11 = uVar34;
      }
      puVar43 = (undefined1 *)
                ((long)(int)(((int)uVar11 >> 2) + (uVar34 - (uVar11 & 0xfffffffc))) * local_170 +
                (long)local_178);
      puVar38 = (undefined1 *)
                ((long)(int)(iVar10 * (int)(float)local_1b8 * uVar34) + (long)local_f8);
      if ((int)uVar18 < 2) {
        uVar34 = 0;
      }
      else {
        iVar30 = 1;
        do {
          *puVar43 = *puVar38;
          puVar43[1] = puVar38[1];
          puVar43 = puVar43 + 2;
          puVar38 = puVar38 + 2;
          iVar30 = iVar30 + 2;
          uVar34 = uVar18 & 0xfffffffe;
        } while (iVar30 < (int)uVar18);
      }
      if ((int)uVar34 < (int)uVar18) {
        lVar37 = 0;
        do {
          puVar43[lVar37] = puVar38[lVar37];
          lVar37 = lVar37 + 1;
        } while (uVar18 - uVar34 != (int)lVar37);
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)local_180);
  }
  local_50 = (undefined1 *)(ulong)(uint)fVar9;
  local_48 = pAVar4;
  local_148._0_4_ = fVar21;
  if (0 < (int)fVar21) {
    local_150 = uVar18 & 0xfffffffe;
    uVar13 = 0;
    do {
      uVar47 = 0;
      fVar21 = 0.0;
      if (local_c0 != (void *)0x0) {
        fVar21 = *(float *)((long)local_c0 + uVar13 * 0x10);
      }
      lVar37 = uVar13 * 4 + 1;
      if (local_c0 != (void *)0x0) {
        uVar47 = *(undefined4 *)((long)local_c0 + lVar37 * 4);
      }
      lVar36 = uVar13 * 4 + 2;
      uVar53 = 0;
      uVar54 = 0;
      if (local_c0 != (void *)0x0) {
        uVar54 = *(undefined4 *)((long)local_c0 + lVar36 * 4);
      }
      lVar41 = uVar13 * 4 + 3;
      if (local_c0 != (void *)0x0) {
        uVar53 = *(undefined4 *)((long)local_c0 + lVar41 * 4);
      }
      local_198 = CONCAT44(local_198._4_4_,uVar47);
      sVar2 = local_68->cstep;
      pvVar39 = local_68->data;
      sVar3 = local_68->elemsize;
      puVar38 = (undefined1 *)(uVar13 * 4 * sVar2 * sVar3 + (long)pvVar39);
      puVar43 = (undefined1 *)(sVar2 * lVar37 * sVar3 + (long)pvVar39);
      puVar45 = (undefined1 *)(sVar2 * lVar36 * sVar3 + (long)pvVar39);
      pcVar40 = (char *)(sVar2 * lVar41 * sVar3 + (long)pvVar39);
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_148._0_4_ = pfVar5[uVar13 * 8];
      local_f8 = (void *)CONCAT44(local_f8._4_4_,pfVar5[uVar13 * 8 + 1]);
      local_1dc = pfVar5[lVar41 * 2];
      local_14c = pfVar5[lVar41 * 2 + 1];
      local_168 = (void *)CONCAT44(local_168._4_4_,fVar21);
      local_1a8._0_4_ = uVar53;
      local_e8._0_4_ = uVar54;
      local_138 = CONCAT44(local_138._4_4_,pfVar5[lVar37 * 2]);
      local_108 = CONCAT44(local_108._4_4_,pfVar5[lVar37 * 2 + 1]);
      local_1b8 = CONCAT44(local_1b8._4_4_,pfVar5[lVar36 * 2]);
      local_1b0 = CONCAT44(local_1b0._4_4_,pfVar5[lVar36 * 2 + 1]);
      local_b8 = uVar13;
      if ((int)fVar9 < 4) {
        puVar16 = (undefined1 *)0x0;
      }
      else {
        local_110 = (char *)(local_170 * uVar13 + (long)local_178);
        puVar16 = (undefined1 *)0x0;
        do {
          pvVar15 = (void *)(((ulong)puVar16 >> 2) * local_1c0 + (long)pvVar46);
          local_1f8 = (void *)0x0;
          uStack_1f0 = 0;
          local_a8[8] = 0;
          local_a8[9] = 0;
          local_a8[10] = 0;
          local_a8[0xb] = 0;
          local_a8[4] = 0;
          local_a8[5] = 0;
          local_a8[6] = 0;
          local_a8[7] = 0;
          local_a8[0] = 0;
          local_a8[1] = 0;
          local_a8[2] = 0;
          local_a8[3] = 0;
          pcVar24 = local_110;
          uVar34 = 0;
          if (1 < (int)uVar18) {
            iVar10 = 0;
            do {
              lVar37 = 0;
              do {
                iVar30 = (int)*(char *)((long)pvVar15 + lVar37) * (int)*pcVar24 +
                         *(int *)((long)&local_1f8 + lVar37 * 2);
                *(int *)((long)&local_1f8 + lVar37 * 2) = iVar30;
                *(int *)((long)&local_1f8 + lVar37 * 2) =
                     (int)*(char *)((long)pvVar15 + lVar37 + 1) * (int)pcVar24[1] + iVar30;
                iVar30 = (int)*(char *)((long)pvVar15 + lVar37) * (int)pcVar24[2] +
                         *(int *)((long)local_a8 + lVar37 * 2 + 0x20);
                *(int *)((long)local_a8 + lVar37 * 2 + 0x20) = iVar30;
                *(int *)((long)local_a8 + lVar37 * 2 + 0x20) =
                     (int)*(char *)((long)pvVar15 + lVar37 + 1) * (int)pcVar24[3] + iVar30;
                iVar30 = (int)*(char *)((long)pvVar15 + lVar37) * (int)pcVar24[4] +
                         *(int *)((long)local_a8 + lVar37 * 2 + 0x10);
                *(int *)((long)local_a8 + lVar37 * 2 + 0x10) = iVar30;
                *(int *)((long)local_a8 + lVar37 * 2 + 0x10) =
                     (int)*(char *)((long)pvVar15 + lVar37 + 1) * (int)pcVar24[5] + iVar30;
                iVar30 = (int)*(char *)((long)pvVar15 + lVar37) * (int)pcVar24[6] +
                         *(int *)((long)local_a8 + lVar37 * 2);
                *(int *)((long)local_a8 + lVar37 * 2) = iVar30;
                *(int *)((long)local_a8 + lVar37 * 2) =
                     (int)*(char *)((long)pvVar15 + lVar37 + 1) * (int)pcVar24[7] + iVar30;
                lVar37 = lVar37 + 2;
              } while (lVar37 != 8);
              pcVar24 = pcVar24 + 8;
              pvVar15 = (void *)((long)pvVar15 + 8);
              iVar30 = iVar10 + 3;
              iVar10 = iVar10 + 2;
              uVar34 = local_150;
            } while (iVar30 < (int)uVar18);
          }
          if ((int)uVar34 < (int)uVar18) {
            do {
              lVar37 = 0;
              do {
                piVar1 = (int *)((long)&local_1f8 + lVar37 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar15 + lVar37) * (int)*pcVar24;
                local_a8[lVar37 + 8] =
                     local_a8[lVar37 + 8] + (int)*(char *)((long)pvVar15 + lVar37) * (int)pcVar24[1]
                ;
                local_a8[lVar37 + 4] =
                     local_a8[lVar37 + 4] + (int)*(char *)((long)pvVar15 + lVar37) * (int)pcVar24[2]
                ;
                local_a8[lVar37] =
                     local_a8[lVar37] + (int)*(char *)((long)pvVar15 + lVar37) * (int)pcVar24[3];
                lVar37 = lVar37 + 1;
              } while (lVar37 != 4);
              pcVar24 = pcVar24 + 4;
              pvVar15 = (void *)((long)pvVar15 + 4);
              uVar34 = uVar34 + 1;
            } while (uVar34 != uVar18);
          }
          lVar37 = 0;
          local_1d8 = puVar43;
          local_b0 = puVar16;
          do {
            fVar21 = roundf(((float)*(int *)((long)&local_1f8 + lVar37 * 4) * (float)local_148._0_4_
                            + fVar21) * (float)local_f8);
            iVar10 = (int)fVar21;
            if (iVar10 < -0x7e) {
              iVar10 = -0x7f;
            }
            uVar7 = (undefined1)iVar10;
            if (0x7e < iVar10) {
              uVar7 = 0x7f;
            }
            puVar38[lVar37] = uVar7;
            fVar21 = roundf(((float)local_a8[lVar37 + 8] * (float)local_138 + (float)local_198) *
                            (float)local_108);
            iVar10 = (int)fVar21;
            if (iVar10 < -0x7e) {
              iVar10 = -0x7f;
            }
            if (0x7e < iVar10) {
              iVar10 = 0x7f;
            }
            local_1d8[lVar37] = (char)iVar10;
            fVar21 = roundf(((float)local_a8[lVar37 + 4] * (float)local_1b8 + (float)local_e8._0_4_)
                            * (float)local_1b0);
            iVar10 = (int)fVar21;
            if (iVar10 < -0x7e) {
              iVar10 = -0x7f;
            }
            uVar7 = (undefined1)iVar10;
            if (0x7e < iVar10) {
              uVar7 = 0x7f;
            }
            puVar45[lVar37] = uVar7;
            fVar21 = roundf(((float)local_a8[lVar37] * local_1dc + (float)local_1a8._0_4_) *
                            local_14c);
            iVar10 = (int)fVar21;
            if (iVar10 < -0x7e) {
              iVar10 = -0x7f;
            }
            cVar8 = (char)iVar10;
            if (0x7e < iVar10) {
              cVar8 = '\x7f';
            }
            pcVar40[lVar37] = cVar8;
            lVar37 = lVar37 + 1;
            fVar21 = (float)local_168;
          } while (lVar37 != 4);
          puVar38 = puVar38 + 4;
          puVar43 = local_1d8 + 4;
          puVar45 = puVar45 + 4;
          pcVar40 = pcVar40 + 4;
          puVar16 = local_b0 + 4;
          pvVar15 = local_118;
        } while (local_b0 + 7 < local_50);
      }
      if ((int)puVar16 < (int)fVar9) {
        local_58 = (char *)(local_170 * local_b8 + (long)local_178);
        do {
          pcVar17 = (char *)((((uint)puVar16 & 3) + ((uint)((ulong)puVar16 >> 2) & 0x3fffffff)) *
                             local_1c0 + (long)pvVar46);
          iVar10 = 0;
          pcVar24 = local_58;
          if ((int)uVar18 < 2) {
            iVar28 = 0;
            iVar30 = 0;
            iVar19 = 0;
            uVar34 = 0;
          }
          else {
            iVar19 = 0;
            iVar31 = 1;
            iVar30 = 0;
            iVar28 = 0;
            iVar10 = 0;
            do {
              iVar32 = (int)*pcVar17;
              iVar35 = (int)pcVar17[1];
              iVar10 = pcVar24[1] * iVar35 + *pcVar24 * iVar32 + iVar10;
              iVar28 = pcVar24[3] * iVar35 + pcVar24[2] * iVar32 + iVar28;
              iVar30 = pcVar24[5] * iVar35 + pcVar24[4] * iVar32 + iVar30;
              iVar19 = pcVar24[7] * iVar35 + pcVar24[6] * iVar32 + iVar19;
              pcVar24 = pcVar24 + 8;
              pcVar17 = pcVar17 + 2;
              iVar31 = iVar31 + 2;
              uVar34 = local_150;
            } while (iVar31 < (int)uVar18);
          }
          if ((int)uVar34 < (int)uVar18) {
            lVar37 = 0;
            do {
              iVar31 = (int)pcVar17[lVar37];
              iVar10 = iVar10 + pcVar24[lVar37 * 4] * iVar31;
              iVar28 = iVar28 + pcVar24[lVar37 * 4 + 1] * iVar31;
              iVar30 = iVar30 + pcVar24[lVar37 * 4 + 2] * iVar31;
              iVar19 = iVar19 + pcVar24[lVar37 * 4 + 3] * iVar31;
              lVar37 = lVar37 + 1;
            } while (uVar18 - uVar34 != (int)lVar37);
          }
          local_1d8 = puVar43;
          local_110 = pcVar40;
          local_b0 = puVar38;
          local_40 = puVar16;
          local_38 = puVar45;
          fVar21 = roundf(((float)iVar10 * (float)local_148._0_4_ + fVar21) * (float)local_f8);
          puVar38 = local_b0;
          iVar10 = (int)fVar21;
          if (iVar10 < -0x7e) {
            iVar10 = -0x7f;
          }
          uVar7 = (undefined1)iVar10;
          if (0x7e < iVar10) {
            uVar7 = 0x7f;
          }
          *local_b0 = uVar7;
          fVar21 = roundf(((float)iVar28 * (float)local_138 + (float)local_198) * (float)local_108);
          puVar43 = local_1d8;
          iVar10 = (int)fVar21;
          if (iVar10 < -0x7e) {
            iVar10 = -0x7f;
          }
          if (0x7e < iVar10) {
            iVar10 = 0x7f;
          }
          *local_1d8 = (char)iVar10;
          fVar21 = roundf(((float)iVar30 * (float)local_1b8 + (float)local_e8._0_4_) *
                          (float)local_1b0);
          puVar45 = local_38;
          iVar10 = (int)fVar21;
          if (iVar10 < -0x7e) {
            iVar10 = -0x7f;
          }
          if (0x7e < iVar10) {
            iVar10 = 0x7f;
          }
          *local_38 = (char)iVar10;
          fVar21 = roundf(((float)iVar19 * local_1dc + (float)local_1a8._0_4_) * local_14c);
          iVar10 = (int)fVar21;
          if (iVar10 < -0x7e) {
            iVar10 = -0x7f;
          }
          if (0x7e < iVar10) {
            iVar10 = 0x7f;
          }
          *local_110 = (char)iVar10;
          puVar38 = puVar38 + 1;
          puVar43 = puVar43 + 1;
          puVar45 = puVar45 + 1;
          pcVar40 = local_110 + 1;
          fVar12 = (float)((int)local_40 + 1);
          puVar16 = (undefined1 *)(ulong)(uint)fVar12;
          fVar21 = (float)local_168;
        } while (fVar12 != fVar9);
      }
      uVar13 = local_b8 + 1;
    } while (uVar13 != local_60);
  }
  if ((int)local_70 != (int)local_180) {
    local_1b8 = CONCAT44(local_1b8._4_4_,uVar18) & 0xfffffffffffffffe;
    lVar37 = (long)(int)local_70;
    pvVar39 = local_c0;
    do {
      if (pvVar39 == (void *)0x0) {
        auVar48 = ZEXT812(0);
      }
      else {
        auVar48._4_8_ = 0;
        auVar48._0_4_ = *(uint *)((long)pvVar39 + lVar37 * 4);
      }
      auVar52._12_4_ = 0;
      auVar52._0_12_ = auVar48;
      puVar27 = (undefined4 *)(local_68->cstep * lVar37 * local_68->elemsize + (long)local_68->data)
      ;
      uVar13 = 0;
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar21 = pfVar5[lVar37 * 2];
      local_e8 = ZEXT416((uint)fVar21);
      local_148._0_4_ = pfVar5[lVar37 * 2 + 1];
      local_148._4_12_ = (undefined1  [12])0x0;
      local_1b0 = lVar37;
      local_1a8 = auVar52;
      if (3 < (int)fVar9) {
        uVar34 = (uint)lVar37;
        uVar11 = uVar34 + 3;
        if (-1 < (int)uVar34) {
          uVar11 = uVar34;
        }
        pcVar40 = (char *)((long)(int)(((int)uVar11 >> 2) + (uVar34 - (uVar11 & 0xfffffffc))) *
                           local_170 + (long)local_178);
        local_f8 = (void *)CONCAT44(fVar21,fVar21);
        local_1a8._0_4_ = auVar48._0_4_;
        local_138 = CONCAT44(local_1a8._0_4_,local_1a8._0_4_);
        fStack_130 = (float)local_1a8._0_4_;
        fStack_12c = (float)local_1a8._0_4_;
        local_108 = CONCAT44(local_148._0_4_,local_148._0_4_);
        uVar44 = 0;
        fStack_100 = (float)local_148._0_4_;
        fStack_fc = (float)local_148._0_4_;
        fStack_f0 = fVar21;
        fStack_ec = fVar21;
        do {
          pvVar39 = (void *)((uVar44 >> 2) * local_1c0 + (long)pvVar46);
          uVar34 = 0;
          local_1f8 = (void *)0x0;
          uStack_1f0 = 0;
          pcVar24 = pcVar40;
          if (1 < (int)uVar18) {
            iVar10 = 0;
            do {
              lVar37 = 0;
              do {
                iVar30 = (int)*(char *)((long)pvVar39 + lVar37 * 2) * (int)*pcVar24 +
                         *(int *)((long)&local_1f8 + lVar37 * 4);
                *(int *)((long)&local_1f8 + lVar37 * 4) = iVar30;
                *(int *)((long)&local_1f8 + lVar37 * 4) =
                     (int)*(char *)((long)pvVar39 + lVar37 * 2 + 1) * (int)pcVar24[1] + iVar30;
                lVar37 = lVar37 + 1;
              } while (lVar37 != 4);
              pcVar24 = pcVar24 + 2;
              pvVar39 = (void *)((long)pvVar39 + 8);
              iVar30 = iVar10 + 3;
              iVar10 = iVar10 + 2;
            } while (iVar30 < (int)uVar18);
            uVar34 = (uint)(float)local_1b8;
          }
          if ((int)uVar34 < (int)uVar18) {
            do {
              lVar37 = 0;
              do {
                piVar1 = (int *)((long)&local_1f8 + lVar37 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar39 + lVar37) * (int)*pcVar24;
                lVar37 = lVar37 + 1;
              } while (lVar37 != 4);
              pcVar24 = pcVar24 + 1;
              pvVar39 = (void *)((long)pvVar39 + 4);
              uVar34 = uVar34 + 1;
            } while (uVar34 != uVar18);
          }
          fStack_1d0 = ((float)(int)uStack_1f0 * fStack_f0 + fStack_130) * fStack_100;
          fStack_1cc = ((float)uStack_1f0._4_4_ * fStack_ec + fStack_12c) * fStack_fc;
          local_1d8 = (undefined1 *)
                      CONCAT44(((float)local_1f8._4_4_ * local_f8._4_4_ + local_138._4_4_) *
                               local_108._4_4_,
                               ((float)(int)local_1f8 * (float)local_f8 + (float)local_138) *
                               (float)local_108);
          local_198._0_4_ = roundf(fStack_1cc);
          local_198._4_4_ = extraout_XMM0_Db;
          fVar21 = roundf(fStack_1d0);
          uStack_18c = local_198._4_4_;
          local_198 = CONCAT44((float)local_198,fVar21);
          fVar21 = roundf((float)local_1d8);
          local_168 = (void *)CONCAT44(extraout_XMM0_Db_00,fVar21);
          fVar21 = roundf(local_1d8._4_4_);
          auVar49._0_4_ = (int)(float)local_168;
          auVar49._4_4_ = (int)fVar21;
          auVar49._8_4_ = (int)(float)local_198;
          auVar49._12_4_ = (int)(float)(local_198 >> 0x20);
          auVar51._0_4_ = -(uint)((int)DAT_0017cbb0 < auVar49._0_4_);
          auVar51._4_4_ = -(uint)(DAT_0017cbb0._4_4_ < auVar49._4_4_);
          auVar51._8_4_ = -(uint)(DAT_0017cbb0._8_4_ < auVar49._8_4_);
          auVar51._12_4_ = -(uint)(DAT_0017cbb0._12_4_ < auVar49._12_4_);
          auVar52 = ~auVar51 & _DAT_0017cbb0 | auVar49 & auVar51;
          auVar50._0_4_ = -(uint)(auVar52._0_4_ < (int)DAT_0017cbc0);
          auVar50._4_4_ = -(uint)(auVar52._4_4_ < DAT_0017cbc0._4_4_);
          auVar50._8_4_ = -(uint)(auVar52._8_4_ < DAT_0017cbc0._8_4_);
          auVar50._12_4_ = -(uint)(auVar52._12_4_ < DAT_0017cbc0._12_4_);
          auVar52 = ~auVar50 & _DAT_0017cbc0 | auVar52 & auVar50;
          auVar52 = packssdw(auVar52,auVar52);
          auVar52 = packsswb(auVar52,auVar52);
          *puVar27 = auVar52._0_4_;
          puVar27 = puVar27 + 1;
          uVar13 = uVar44 + 4;
          puVar43 = (undefined1 *)(uVar44 + 7);
          pvVar39 = local_c0;
          uVar44 = uVar13;
        } while (puVar43 < local_50);
      }
      pvVar22 = local_178;
      if ((int)uVar13 < (int)fVar9) {
        uVar34 = (uint)local_1b0;
        uVar11 = uVar34 + 3;
        if (-1 < (int)uVar34) {
          uVar11 = uVar34;
        }
        lVar37 = (long)(int)(((int)uVar11 >> 2) + (uVar34 - (uVar11 & 0xfffffffc))) * local_170;
        do {
          if ((int)uVar18 < 1) {
            fVar21 = 0.0;
          }
          else {
            lVar36 = 0;
            iVar10 = 0;
            do {
              iVar10 = iVar10 + (int)*(char *)((long)pvVar46 +
                                              lVar36 + (((uint)uVar13 & 3) +
                                                       ((uint)(uVar13 >> 2) & 0x3fffffff)) *
                                                       local_1c0) *
                                (int)*(char *)((long)pvVar22 + lVar36 + lVar37);
              lVar36 = lVar36 + 1;
            } while (uVar18 != (uint)lVar36);
            fVar21 = (float)iVar10;
          }
          fVar21 = roundf((fVar21 * (float)local_e8._0_4_ + (float)local_1a8._0_4_) *
                          (float)local_148._0_4_);
          iVar10 = (int)fVar21;
          if (iVar10 < -0x7e) {
            iVar10 = -0x7f;
          }
          uVar7 = (undefined1)iVar10;
          if (0x7e < iVar10) {
            uVar7 = 0x7f;
          }
          *(undefined1 *)puVar27 = uVar7;
          puVar27 = (undefined4 *)((long)puVar27 + 1);
          fVar21 = (float)((uint)uVar13 + 1);
          uVar13 = (ulong)(uint)fVar21;
        } while (fVar21 != fVar9);
      }
      lVar37 = local_1b0 + 1;
    } while (lVar37 < (long)local_180);
  }
  pAVar4 = local_c8;
  piVar6 = local_120;
  piVar1 = local_128;
  if (local_78 != (int *)0x0) {
    LOCK();
    *local_78 = *local_78 + -1;
    UNLOCK();
    if (*local_78 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_178 != (void *)0x0) {
          free(local_178);
        }
      }
      else {
        (*local_48->_vptr_Allocator[3])();
      }
    }
  }
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (pAVar4 == (Allocator *)0x0) {
        if (pvVar46 != (void *)0x0) {
          free(pvVar46);
        }
      }
      else {
        (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar46);
      }
    }
  }
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_d0 == (Allocator *)0x0) {
        if (pvVar15 != (void *)0x0) {
          free(pvVar15);
        }
      }
      else {
        (*local_d0->_vptr_Allocator[3])(local_d0,pvVar15);
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i+1);
            signed char* output2 = top_blob.channel(i+2);
            signed char* output3 = top_blob.channel(i+3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];
            const float scale_requant_in1  = scale_requant[2*(i+1)];
            const float scale_requant_out1 = scale_requant[2*(i+1)+1];
            const float scale_requant_in2  = scale_requant[2*(i+2)];
            const float scale_requant_out2 = scale_requant[2*(i+2)+1];
            const float scale_requant_in3  = scale_requant[2*(i+3)];
            const float scale_requant_out3 = scale_requant[2*(i+3)+1];

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}